

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_checksum.cpp
# Opt level: O3

uint lzham::crc32(uint crc,lzham_uint8 *ptr,size_t buf_len)

{
  uint uVar1;
  size_t sVar2;
  
  if (ptr != (lzham_uint8 *)0x0) {
    if (buf_len != 0) {
      uVar1 = ~crc;
      sVar2 = 0;
      do {
        uVar1 = uVar1 >> 4 ^ *(uint *)(s_crc32 + (ulong)((uVar1 ^ ptr[sVar2]) & 0xf) * 4);
        uVar1 = uVar1 >> 4 ^ *(uint *)(s_crc32 + (ulong)((uint)(ptr[sVar2] >> 4) ^ uVar1 & 0xf) * 4)
        ;
        sVar2 = sVar2 + 1;
      } while (buf_len != sVar2);
      crc = ~uVar1;
    }
    return crc;
  }
  return 0;
}

Assistant:

uint crc32(uint crc, const lzham_uint8 *ptr, size_t buf_len)
   {
      if (!ptr) 
         return cInitCRC32;

      crc = ~crc; 
      while (buf_len--) 
      { 
         lzham_uint8 b = *ptr++; 
         crc = (crc >> 4) ^ s_crc32[(crc & 0xF) ^ (b & 0xF)]; 
         crc = (crc >> 4) ^ s_crc32[(crc & 0xF) ^ (b >> 4)]; 
      }
      return ~crc;
   }